

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::BuiltInFunctionStmtBlock::BuiltInFunctionStmtBlock
          (BuiltInFunctionStmtBlock *this,Generator *parent,string *function_name)

{
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_d8;
  undefined1 auStack_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> known_functions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  functions;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_d8,(string *)function_name);
  FunctionStmtBlock::FunctionStmtBlock(&this->super_FunctionStmtBlock,parent,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  (this->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002a6c58;
  get_builtin_function_info
            ((optional<kratos::BuiltinFunctionInfo> *)((long)&known_functions.field_2 + 8),
             function_name);
  if (functions._M_t._M_impl.super__Rb_tree_header._M_header._4_1_ != '\0') {
    return;
  }
  get_builtin_function_names_abi_cxx11_();
  local_48._M_dataplus._M_p = (pointer)&functions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_48._M_string_length =
       (size_type)
       fmt::v7::detail::
       value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
       format_custom_arg<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,fmt::v7::formatter<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,char,void>>
  ;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xf;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_b8,(detail *)bVar1.data_,format_str,args);
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(function_name->_M_dataplus)._M_p;
  bVar1 = fmt::v7::to_string_view<char,_0>
                    (
                    "{0} is either not supported or not a system built-in. Supported methods are:{1}"
                    );
  format_str_00.data_ = (char *)bVar1.size_;
  format_str_00.size_ = 0xdd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&functions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)bVar1.data_,format_str_00,args_00);
  UserException::UserException(this_00,&local_48);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BuiltInFunctionStmtBlock::BuiltInFunctionStmtBlock(Generator *parent,
                                                   const std::string &function_name)
    : FunctionStmtBlock(parent, function_name) {
    if (!get_builtin_function_info(function_name)) {
        auto functions = get_builtin_function_names();
        auto known_functions = ::format("{0}", fmt::join(functions.begin(), functions.end(), "\n"));
        throw UserException(::format(
            "{0} is either not supported or not a system built-in. Supported methods are:{1}",
            function_name, known_functions));
    }
}